

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

VkPipelineRasterizationStateCreateInfo * __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::getRasterizationStateCreateInfo
          (BaseRenderingTestInstance *this)

{
  int iVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  BaseRenderingTestInstance *this_local;
  
  if (rasterization::(anonymous_namespace)::BaseRenderingTestInstance::
      getRasterizationStateCreateInfo()::rasterizationStateCreateInfo == '\0') {
    iVar1 = __cxa_guard_acquire(&rasterization::(anonymous_namespace)::BaseRenderingTestInstance::
                                 getRasterizationStateCreateInfo()::rasterizationStateCreateInfo);
    if (iVar1 != 0) {
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.sType =
           VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.pNext = (void *)0x0;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.flags = 0;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.depthClampEnable = 0;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.rasterizerDiscardEnable = 0;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.polygonMode =
           VK_POLYGON_MODE_FILL;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.cullMode = 0;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.frontFace =
           VK_FRONT_FACE_COUNTER_CLOCKWISE;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.depthBiasEnable = 0;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.depthBiasConstantFactor = 0.0;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.depthBiasClamp = 0.0;
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.depthBiasSlopeFactor = 0.0;
      (*(this->super_TestInstance)._vptr_TestInstance[3])();
      getRasterizationStateCreateInfo::rasterizationStateCreateInfo.lineWidth = extraout_XMM0_Da;
      __cxa_guard_release(&rasterization::(anonymous_namespace)::BaseRenderingTestInstance::
                           getRasterizationStateCreateInfo()::rasterizationStateCreateInfo);
    }
  }
  (*(this->super_TestInstance)._vptr_TestInstance[3])();
  getRasterizationStateCreateInfo::rasterizationStateCreateInfo.lineWidth = extraout_XMM0_Da_00;
  return &getRasterizationStateCreateInfo::rasterizationStateCreateInfo;
}

Assistant:

const VkPipelineRasterizationStateCreateInfo* BaseRenderingTestInstance::getRasterizationStateCreateInfo (void) const
{
	static VkPipelineRasterizationStateCreateInfo	rasterizationStateCreateInfo	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType							sType;
		DE_NULL,														// const void*								pNext;
		0,																// VkPipelineRasterizationStateCreateFlags	flags;
		false,															// VkBool32									depthClipEnable;
		false,															// VkBool32									rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkFillMode								fillMode;
		VK_CULL_MODE_NONE,												// VkCullMode								cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,								// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBias;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									slopeScaledDepthBias;
		getLineWidth(),													// float									lineWidth;
	};

	rasterizationStateCreateInfo.lineWidth = getLineWidth();
	return &rasterizationStateCreateInfo;
}